

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilUtil.c
# Opt level: O2

char * Extra_UtilFileSearch(char *file,char *path,char *mode)

{
  int iVar1;
  char *__ptr;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  char *pcVar5;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    path = ".";
  }
  __ptr = Extra_UtilStrsav(path);
  pcVar5 = __ptr;
  do {
    pcVar2 = strchr(pcVar5,0x3a);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
    }
    if ((*pcVar5 == '.') && (pcVar5[1] == '\0')) {
      __s = Extra_UtilStrsav(file);
    }
    else {
      sVar3 = strlen(pcVar5);
      sVar4 = strlen(file);
      __s = (char *)malloc(sVar3 + sVar4 + 4);
      sprintf(__s,"%s/%s",pcVar5,file);
    }
    pcVar5 = Extra_UtilStrsav(__s);
    free(__s);
    iVar1 = Extra_UtilCheckFile(pcVar5,mode);
    if (iVar1 != 0) goto LAB_00390972;
    free(pcVar5);
    pcVar5 = pcVar2 + 1;
  } while (pcVar2 != (char *)0x0);
  pcVar5 = (char *)0x0;
LAB_00390972:
  free(__ptr);
  return pcVar5;
}

Assistant:

char * Extra_UtilFileSearch(char *file, char *path, char *mode)
//char *file;			// file we're looking for 
//char *path;			// search path, colon separated 
//char *mode;			// "r", "w", or "x" 
{
    int quit;
    char *buffer, *filename, *save_path, *cp;

    if (path == 0 || strcmp(path, "") == 0) {
	path = ".";		/* just look in the current directory */
    }

    save_path = path = Extra_UtilStrsav(path);
    quit = 0;
    do {
	cp = strchr(path, ':');
	if (cp != 0) {
	    *cp = '\0';
	} else {
	    quit = 1;
	}

	/* cons up the filename out of the path and file name */
	if (strcmp(path, ".") == 0) {
	    buffer = Extra_UtilStrsav(file);
	} else {
	    buffer = ABC_ALLOC(char, strlen(path) + strlen(file) + 4);
	    (void) sprintf(buffer, "%s/%s", path, file);
	}
	filename = Extra_UtilTildeExpand(buffer);
	ABC_FREE(buffer);

	/* see if we can access it */
	if (Extra_UtilCheckFile(filename, mode)) {
	    ABC_FREE(save_path);
	    return filename;
	}
	ABC_FREE(filename);
	path = ++cp;
    } while (! quit); 

    ABC_FREE(save_path);
    return 0;
}